

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O3

int flatcc_verify_union_vector_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              flatcc_union_verifier_f *uvf)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  long lVar5;
  int iVar6;
  ushort uVar7;
  flatbuffers_voffset_t id_00;
  uint uVar8;
  flatbuffers_voffset_t vo;
  ushort uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  flatbuffers_uoffset_t base;
  flatcc_union_verifier_descriptor_t local_58;
  uint local_34;
  
  id_00 = id - 1;
  uVar9 = id * 2 + 2;
  uVar1 = td->vsize;
  if ((uVar9 < uVar1) && (uVar7 = *(ushort *)((long)td->vtable + (ulong)uVar9), uVar7 != 0)) {
    iVar6 = flatcc_verify_vector_field(td,id_00,required,1,1,0xffffffff);
    if (iVar6 != 0) {
LAB_001229cf:
      iVar6 = flatcc_verify_vector_field(td,id_00,required,1,1,0xffffffff);
      return iVar6;
    }
  }
  else {
    uVar7 = id * 2 + 4;
    if (uVar7 < uVar1) {
      bVar12 = *(short *)((long)td->vtable + (ulong)uVar7) != 0;
    }
    else {
      bVar12 = false;
    }
    if ((required != 0) && (!bVar12)) {
      return 0x16;
    }
    iVar6 = flatcc_verify_vector_field(td,id_00,required,1,1,0xffffffff);
    if (iVar6 != 0) goto LAB_001229cf;
    if (uVar1 <= uVar9) {
      return 0;
    }
    uVar7 = *(ushort *)((long)td->vtable + (ulong)uVar9);
    if (uVar7 == 0) {
      return 0;
    }
  }
  pvVar4 = td->buf;
  lVar5 = (ulong)uVar7 + (ulong)td->table;
  uVar10 = (ulong)*(uint *)((long)pvVar4 + (ulong)uVar7 + (ulong)td->table);
  uVar2 = *(uint *)((long)pvVar4 + uVar10 + lVar5);
  iVar6 = get_offset_field(td,id,required,&local_34);
  if (local_34 != 0 && iVar6 == 0) {
    if (td->ttl < 1) {
      iVar6 = 3;
    }
    else {
      uVar8 = *(int *)((long)pvVar4 + (ulong)local_34) + local_34;
      iVar6 = 0x10;
      if (local_34 < uVar8) {
        local_58.end = td->end;
        if ((uVar8 & 3) == 0 && (ulong)uVar8 + 4 <= (ulong)local_58.end) {
          uVar3 = *(uint *)((long)pvVar4 + (ulong)uVar8);
          if (uVar3 < 0x40000000 && (uVar8 & 3) == 0) {
            iVar6 = 0x1a;
            if ((uVar3 * 4 <= (local_58.end - uVar8) - 4) && (iVar6 = 0x22, uVar3 == uVar2)) {
              local_58.ttl = td->ttl + -1;
              if ((ulong)uVar2 == 0) {
                iVar6 = 0;
              }
              else {
                uVar8 = *(int *)((long)pvVar4 + (ulong)local_34) + local_34;
                uVar11 = 0;
                local_58.buf = pvVar4;
                do {
                  uVar8 = uVar8 + 4;
                  local_58.offset = *(flatbuffers_uoffset_t *)((long)pvVar4 + (ulong)uVar8);
                  local_58.type =
                       *(flatbuffers_utype_t *)((long)pvVar4 + uVar11 + uVar10 + lVar5 + 4);
                  if (local_58.offset == 0) {
                    if (local_58.type != '\0') {
                      return 0x20;
                    }
                  }
                  else {
                    if (local_58.type == '\0') {
                      return 0x21;
                    }
                    local_58.base = uVar8;
                    iVar6 = (*uvf)(&local_58);
                    if (iVar6 != 0) {
                      iVar6 = (*uvf)(&local_58);
                      return iVar6;
                    }
                  }
                  uVar11 = uVar11 + 1;
                  iVar6 = 0;
                } while (uVar2 != uVar11);
              }
            }
          }
          else {
            iVar6 = (uint)((uVar8 & 3) == 0) * 9 + 0x10;
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int flatcc_verify_union_vector_field(flatcc_table_verifier_descriptor_t *td,
    flatbuffers_voffset_t id, int required, flatcc_union_verifier_f uvf)
{
    voffset_t vte_type, vte_table;
    const uoffset_t *buf;
    const utype_t *types;
    uoffset_t count, base;

    if (0 == (vte_type = read_vt_entry(td, id - 1))) {
        if (0 == (vte_table = read_vt_entry(td, id))) {
            verify(!required, flatcc_verify_error_type_field_absent_from_required_union_vector_field);
        }
    }
    check_result(flatcc_verify_vector_field(td, id - 1, required,
                utype_size, utype_size, FLATBUFFERS_COUNT_MAX(utype_size)));
    if (0 == (buf = get_field_ptr(td, id - 1))) {
        return flatcc_verify_ok;
    }
    buf = (const uoffset_t *)((size_t)buf + read_uoffset(buf, 0));
    count = read_uoffset(buf, 0);
    ++buf;
    types = (utype_t *)buf;

    check_field(td, id, required, base);
    return verify_union_vector(td->buf, td->end, base, read_uoffset(td->buf, base),
            count, types, td->ttl, uvf);
}